

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

void parse_version(htsFormat *fmt,uchar *u,uchar *ulim)

{
  uchar uVar1;
  ushort *puVar2;
  short sVar3;
  int iVar4;
  ushort **ppuVar5;
  uchar *puVar6;
  uchar *puVar7;
  
  (fmt->version).major = -1;
  (fmt->version).minor = -1;
  puVar7 = u;
  while( true ) {
    if (ulim <= puVar7) {
      return;
    }
    ppuVar5 = __ctype_b_loc();
    puVar2 = *ppuVar5;
    if ((*(byte *)((long)puVar2 + (long)(char)*puVar7 * 2 + 1) & 8) == 0) break;
    puVar7 = puVar7 + 1;
  }
  iVar4 = atoi((char *)u);
  (fmt->version).major = (short)iVar4;
  if (*puVar7 == '.') {
    puVar6 = puVar7 + 1;
    do {
      if (ulim <= puVar6) {
        return;
      }
      uVar1 = *puVar6;
      puVar6 = puVar6 + 1;
    } while ((*(byte *)((long)puVar2 + (long)(char)uVar1 * 2 + 1) & 8) != 0);
    iVar4 = atoi((char *)(puVar7 + 1));
    sVar3 = (short)iVar4;
  }
  else {
    sVar3 = 0;
  }
  (fmt->version).minor = sVar3;
  return;
}

Assistant:

static void
parse_version(htsFormat *fmt, const unsigned char *u, const unsigned char *ulim)
{
    const char *str  = (const char *) u;
    const char *slim = (const char *) ulim;
    const char *s;

    fmt->version.major = fmt->version.minor = -1;

    for (s = str; s < slim; s++) if (!isdigit(*s)) break;
    if (s < slim) {
        fmt->version.major = atoi(str);
        if (*s == '.') {
            str = &s[1];
            for (s = str; s < slim; s++) if (!isdigit(*s)) break;
            if (s < slim)
                fmt->version.minor = atoi(str);
        }
        else
            fmt->version.minor = 0;
    }
}